

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

ETraceStatus ProcessRailHit(FTraceResults *res,void *userdata)

{
  DThinker *pDVar1;
  int iVar2;
  undefined1 local_7c [4];
  DVector2 ofs;
  undefined1 local_68 [40];
  AActor *local_40;
  DThinker *local_38;
  AActor *pAStack_30;
  AActor **local_28;
  
  if (res->HitType != TRACE_HitActor) {
    if (res->HitType == TRACE_CrossingPortal) {
      local_68._16_8_ = (res->HitPos).Z;
      local_68._0_8_ = (res->HitPos).X;
      local_68._8_8_ = (res->HitPos).Y;
      local_40 = (AActor *)(res->SrcFromTarget).Z;
      local_68._24_8_ = (res->SrcFromTarget).X;
      local_68._32_8_ = (res->SrcFromTarget).Y;
      local_28 = (AActor **)(res->HitVector).Z;
      local_38 = (DThinker *)(res->HitVector).X;
      pAStack_30 = (AActor *)(res->HitVector).Y;
      TArray<SPortalHit,_SPortalHit>::Push
                ((TArray<SPortalHit,_SPortalHit> *)((long)userdata + 0x18),(SPortalHit *)local_68);
      return TRACE_Continue;
    }
    return TRACE_Stop;
  }
  if ((*(char *)((long)userdata + 0x2d) == '\x01') &&
     (((res->Actor->flags2).Value & 0x8000000) != 0)) {
    return TRACE_Stop;
  }
  if (*(char *)((long)userdata + 0x31) == '\0') {
    if (*(char *)((long)userdata + 0x30) == '\x01') {
      AActor::GetSpecies((AActor *)local_68);
      AActor::GetSpecies((AActor *)&ofs);
      if (local_68._0_4_ == ofs.X._0_4_) {
        return TRACE_Skip;
      }
    }
    if ((*(char *)((long)userdata + 0x2f) != '\x01') ||
       (AActor::GetSpecies((AActor *)local_7c),
       local_7c != (undefined1  [4])*(int *)((long)userdata + 0x28))) {
      if (*(char *)((long)userdata + 0x2e) == '\x01') {
        local_68._0_8_ = res->Actor;
        if (((((AActor *)local_68._0_8_)->flags3).Value & 8) != 0) {
          return TRACE_Skip;
        }
      }
      else {
        local_68._0_8_ = res->Actor;
      }
      pDVar1 = (DThinker *)(res->HitPos).Z;
      local_68._8_8_ = (res->HitPos).X;
      local_68._16_8_ = (res->HitPos).Y;
      local_68._32_8_ = (res->SrcAngleFromTarget).Degrees;
      local_68._24_8_ = pDVar1;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition((double)local_68._8_8_,(double)local_68._16_8_,
                            (res->HitVector).X * -10.0,(res->HitVector).Y * -10.0);
        local_68._8_8_ = CONCAT44(ofs.X._4_4_,ofs.X._0_4_);
        local_68._16_8_ = ofs.Y;
        local_68._24_8_ = (double)pDVar1 + (res->HitVector).Z * 10.0;
      }
      TArray<SRailHit,_SRailHit>::Push
                ((TArray<SRailHit,_SRailHit> *)((long)userdata + 8),(SRailHit *)local_68);
      if (*(int *)((long)userdata + 0x34) == 0) {
        return *(byte *)((long)userdata + 0x2c) ^ TRACE_Continue;
      }
      iVar2 = *(int *)((long)userdata + 0x38) + 1;
      *(int *)((long)userdata + 0x38) = iVar2;
      if (*(char *)((long)userdata + 0x2c) == '\0') {
        return (uint)(iVar2 < *(int *)((long)userdata + 0x34));
      }
      return TRACE_Stop;
    }
  }
  return TRACE_Skip;
}

Assistant:

static ETraceStatus ProcessRailHit(FTraceResults &res, void *userdata)
{
	RailData *data = (RailData *)userdata;
	if (res.HitType == TRACE_CrossingPortal)
	{
		SPortalHit newhit;
		newhit.HitPos = res.HitPos;
		newhit.ContPos = res.SrcFromTarget;
		newhit.OutDir = res.HitVector;
		data->PortalHits.Push(newhit);
		return TRACE_Continue;
	}

	if (res.HitType != TRACE_HitActor)
	{
		return TRACE_Stop;
	}

	// Invulnerable things completely block the shot
	if (data->StopAtInvul && res.Actor->flags2 & MF2_INVULNERABLE)
	{
		return TRACE_Stop;
	}

	// Skip actors if the puff has:
	// 1. THRUACTORS (This one did NOT include a check for spectral)
	// 2. MTHRUSPECIES on puff and the shooter has same species as the hit actor
	// 3. THRUSPECIES on puff and the puff has same species as the hit actor
	// 4. THRUGHOST on puff and the GHOST flag on the hit actor

	if ((data->ThruActors) ||
		(data->MThruSpecies && res.Actor->GetSpecies() == data->Caller->GetSpecies()) ||
		(data->ThruSpecies && res.Actor->GetSpecies() == data->PuffSpecies) ||
		(data->ThruGhosts && res.Actor->flags3 & MF3_GHOST))
	{
		return TRACE_Skip;
	}

	// Save this thing for damaging later, and continue the trace
	SRailHit newhit;
	newhit.HitActor = res.Actor;
	newhit.HitPos = res.HitPos;
	newhit.HitAngle = res.SrcAngleFromTarget;
	if (i_compatflags & COMPATF_HITSCAN)
	{
		DVector2 ofs = P_GetOffsetPosition(newhit.HitPos.X, newhit.HitPos.Y, -10 * res.HitVector.X, -10 * res.HitVector.Y);
		newhit.HitPos.X = ofs.X;
		newhit.HitPos.Y = ofs.Y;
		newhit.HitPos.Z -= -10 * res.HitVector.Z;
	}
	data->RailHits.Push(newhit);

	if (data->limit)
	{
		data->count++;
	}
	return (data->StopAtOne || (data->limit && (data->count >= data->limit))) ? TRACE_Stop : TRACE_Continue;
}